

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exports.cpp
# Opt level: O0

void io::export_map_connections_as_json(World *world,string *file_path)

{
  bool bVar1;
  vector<MapConnection,_std::allocator<MapConnection>_> *this;
  initializer_list_t init;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  reference local_68;
  MapConnection *connection;
  const_iterator __end1;
  const_iterator __begin1;
  vector<MapConnection,_std::allocator<MapConnection>_> *__range1;
  Json map_connections_json;
  string *file_path_local;
  World *world_local;
  
  map_connections_json.m_value = (json_value)file_path;
  std::
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::initializer_list((initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&__range1);
  init._M_len = (size_type)__range1;
  init._M_array = (iterator)&stack0xffffffffffffffd8;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::array(init);
  this = World::map_connections(world);
  __end1 = std::vector<MapConnection,_std::allocator<MapConnection>_>::begin(this);
  connection = (MapConnection *)
               std::vector<MapConnection,_std::allocator<MapConnection>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_MapConnection_*,_std::vector<MapConnection,_std::allocator<MapConnection>_>_>
                      (&__end1,(__normal_iterator<const_MapConnection_*,_std::vector<MapConnection,_std::allocator<MapConnection>_>_>
                                *)&connection);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_68 = __gnu_cxx::
               __normal_iterator<const_MapConnection_*,_std::vector<MapConnection,_std::allocator<MapConnection>_>_>
               ::operator*(&__end1);
    MapConnection::to_json_abi_cxx11_((MapConnection *)&local_78);
    nlohmann::
    basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::
    emplace_back<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&stack0xffffffffffffffd8,&local_78);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_78);
    __gnu_cxx::
    __normal_iterator<const_MapConnection_*,_std::vector<MapConnection,_std::allocator<MapConnection>_>_>
    ::operator++(&__end1);
  }
  dump_json_to_file((Json *)&stack0xffffffffffffffd8,(string *)map_connections_json.m_value.object);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void io::export_map_connections_as_json(const World& world, const std::string& file_path)
{
    Json map_connections_json = Json::array();
    for(const MapConnection& connection : world.map_connections())
        map_connections_json.emplace_back(connection.to_json());
    dump_json_to_file(map_connections_json, file_path);
}